

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexBeginWrite(Fts5Index *p,int bDelete,i64 iRowid)

{
  Fts5Config *pFVar1;
  Fts5Hash *p_00;
  Fts5HashEntry **__s;
  int iVar2;
  
  if (p->pHash == (Fts5Hash *)0x0) {
    pFVar1 = p->pConfig;
    p_00 = (Fts5Hash *)sqlite3_malloc(0x28);
    p->pHash = p_00;
    iVar2 = 7;
    if (p_00 != (Fts5Hash *)0x0) {
      *(undefined8 *)p_00 = 0;
      p_00->pnByte = (int *)0x0;
      p_00->nEntry = 0;
      p_00->nSlot = 0;
      p_00->pScan = (Fts5HashEntry *)0x0;
      p_00->aSlot = (Fts5HashEntry **)0x0;
      p_00->pnByte = &p->nPendingData;
      p_00->eDetail = pFVar1->eDetail;
      p_00->nSlot = 0x400;
      __s = (Fts5HashEntry **)sqlite3_malloc64(0x2000);
      p_00->aSlot = __s;
      if (__s == (Fts5HashEntry **)0x0) {
        sqlite3_free(p_00);
        p->pHash = (Fts5Hash *)0x0;
      }
      else {
        iVar2 = 0;
        memset(__s,0,0x2000);
      }
    }
    p->rc = iVar2;
  }
  if ((iRowid < p->iWriteRowid) ||
     (((p->iWriteRowid == iRowid && (p->bDelete == 0)) || (p->pConfig->nHashSize < p->nPendingData))
     )) {
    fts5IndexFlush(p);
  }
  p->iWriteRowid = iRowid;
  p->bDelete = bDelete;
  if (bDelete == 0) {
    p->nPendingRow = p->nPendingRow + 1;
  }
  iVar2 = p->rc;
  p->rc = 0;
  return iVar2;
}

Assistant:

static int sqlite3Fts5IndexBeginWrite(Fts5Index *p, int bDelete, i64 iRowid){
  assert( p->rc==SQLITE_OK );

  /* Allocate the hash table if it has not already been allocated */
  if( p->pHash==0 ){
    p->rc = sqlite3Fts5HashNew(p->pConfig, &p->pHash, &p->nPendingData);
  }

  /* Flush the hash table to disk if required */
  if( iRowid<p->iWriteRowid
   || (iRowid==p->iWriteRowid && p->bDelete==0)
   || (p->nPendingData > p->pConfig->nHashSize)
  ){
    fts5IndexFlush(p);
  }

  p->iWriteRowid = iRowid;
  p->bDelete = bDelete;
  if( bDelete==0 ){
    p->nPendingRow++;
  }
  return fts5IndexReturn(p);
}